

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall boost::runtime::basic_param::value_help(basic_param *this,ostream *ostr)

{
  if ((this->p_value_hint)._M_string_length != 0) {
    std::operator<<(ostr,(string *)&this->p_value_hint);
    return;
  }
  std::operator<<(ostr,"<value>");
  return;
}

Assistant:

virtual void            value_help( std::ostream& ostr ) const
    {
        if( p_value_hint.empty() )
            ostr << "<value>";
        else
            ostr << p_value_hint;
    }